

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

char * __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,XMLCh *toTranscode,MemoryManager *manager)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLSize_t XVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 auVar5 [16];
  XMLMutexLock local_88;
  XMLMutexLock lockConverter_1;
  XMLMutexLock lockConverter;
  UErrorCode local_70;
  int32_t targetCap;
  UErrorCode err;
  int local_5c;
  undefined1 local_58 [4];
  int32_t targetLen;
  ArrayJanitor<char16_t> janTmp;
  UChar *ncActual;
  UChar *actualSrc;
  XMLSize_t srcLen;
  char *retBuf;
  MemoryManager *manager_local;
  XMLCh *toTranscode_local;
  ICULCPTranscoder *this_local;
  
  if (toTranscode == (XMLCh *)0x0) {
    this_local = (ICULCPTranscoder *)0x0;
  }
  else if (*toTranscode == L'\0') {
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,1);
    this_local = (ICULCPTranscoder *)CONCAT44(extraout_var,iVar2);
    *(undefined1 *)&(this_local->super_XMLLCPTranscoder)._vptr_XMLLCPTranscoder = 0;
  }
  else {
    XVar4 = XMLString::stringLen(toTranscode);
    janTmp.fMemoryManager = (MemoryManager *)0x0;
    ArrayJanitor<char16_t>::ArrayJanitor((ArrayJanitor<char16_t> *)local_58,(char16_t *)0x0,manager)
    ;
    auVar5._8_4_ = (int)(XVar4 >> 0x20);
    auVar5._0_8_ = XVar4;
    auVar5._12_4_ = 0x45300000;
    local_5c = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)XVar4) - 4503599627370496.0)) * 1.25);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,(long)(local_5c + 1));
    srcLen = CONCAT44(extraout_var_00,iVar2);
    local_70 = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&lockConverter_1,&this->fMutex);
    iVar2 = ucnv_fromUChars_70(this->fConverter,srcLen,local_5c + 1,toTranscode,0xffffffff,&local_70
                              );
    XMLMutexLock::~XMLMutexLock(&lockConverter_1);
    if ((local_70 == U_BUFFER_OVERFLOW_ERROR) || (local_70 == U_STRING_NOT_TERMINATED_WARNING)) {
      local_70 = U_ZERO_ERROR;
      (*manager->_vptr_MemoryManager[4])(manager,srcLen);
      iVar3 = (*manager->_vptr_MemoryManager[3])(manager,(long)(iVar2 + 1));
      srcLen = CONCAT44(extraout_var_01,iVar3);
      XMLMutexLock::XMLMutexLock(&local_88,&this->fMutex);
      ucnv_fromUChars_70(this->fConverter,srcLen,iVar2 + 1,toTranscode,0xffffffff,&local_70);
      XMLMutexLock::~XMLMutexLock(&local_88);
    }
    UVar1 = U_FAILURE(local_70);
    if (UVar1 == '\0') {
      this_local = (ICULCPTranscoder *)srcLen;
    }
    else {
      (*manager->_vptr_MemoryManager[4])(manager,srcLen);
      this_local = (ICULCPTranscoder *)0x0;
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_58);
  }
  return (char *)this_local;
}

Assistant:

char* ICULCPTranscoder::transcode(const XMLCh* const toTranscode,
                                  MemoryManager* const manager)
{
    char* retBuf = 0;

    // Check for a couple of special cases
    if (!toTranscode)
        return retBuf;

    if (!*toTranscode)
    {
        retBuf = (char*) manager->allocate(sizeof(char));//new char[1];
        retBuf[0] = 0;
        return retBuf;
    }

    //
    //  Get the length of the source string since we'll have to use it in
    //  a couple places below.
    //
    const XMLSize_t srcLen = XMLString::stringLen(toTranscode);

    //
    //  If XMLCh and UChar are not the same size, then we have to make a
    //  temp copy of the text to pass to ICU.
    //
    const UChar* actualSrc;
    UChar* ncActual = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        actualSrc = (const UChar*)toTranscode;
    }
    else
    {
        // Allocate a non-const temp buf, but store it also in the actual
        ncActual = convertToUChar(toTranscode, 0, manager);
        actualSrc = ncActual;
    }

    // Insure that the temp buffer, if any, gets cleaned up via the nc pointer
    ArrayJanitor<UChar> janTmp(ncActual, manager);

    // Caculate a return buffer size not too big, but less likely to overflow
    int32_t targetLen = (int32_t)(srcLen * 1.25);

    // Allocate the return buffer
    retBuf = (char*) manager->allocate((targetLen + 1) * sizeof(char));//new char[targetLen + 1];

    //
    //  Lock now while we call the converter. Use a faux block to do the
    //  lock so that it unlocks immediately afterwards.
    //
    UErrorCode err = U_ZERO_ERROR;
    int32_t targetCap;
    {
        XMLMutexLock lockConverter(&fMutex);

        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetLen + 1
            , actualSrc
            , -1
            , &err
        );
    }

    // If targetLen is not enough then buffer overflow might occur
    if ((err == U_BUFFER_OVERFLOW_ERROR) || (err == U_STRING_NOT_TERMINATED_WARNING))
    {
        //
        //  Reset the error, delete the old buffer, allocate a new one,
        //  and try again.
        //
        err = U_ZERO_ERROR;
        manager->deallocate(retBuf);//delete [] retBuf;
        retBuf = (char*) manager->allocate((targetCap + 1) * sizeof(char));//new char[targetCap + 1];

        // Lock again before we retry
        XMLMutexLock lockConverter(&fMutex);
        targetCap = ucnv_fromUChars
        (
            fConverter
            , retBuf
            , targetCap + 1
            , actualSrc
            , -1
            , &err
        );
    }

    if (U_FAILURE(err))
    {
        manager->deallocate(retBuf);//delete [] retBuf;
        return 0;
    }

    return retBuf;
}